

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O0

TRef lj_opt_narrow_arith(jit_State *J,TRef rb,TRef rc,TValue *vb,TValue *vc,IROp op)

{
  TRef TVar1;
  int iVar2;
  double in_RDI;
  jit_State *in_R8;
  uint in_R9D;
  double n;
  TRef in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  TRef local_68;
  undefined2 uVar3;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  
  TVar1 = conv_str_tonum((jit_State *)CONCAT44(in_R9D,in_stack_ffffffffffffff80),
                         in_stack_ffffffffffffff7c,(TValue *)0x16ab96);
  local_68 = conv_str_tonum((jit_State *)CONCAT44(in_R9D,in_stack_ffffffffffffff80),
                            in_stack_ffffffffffffff7c,(TValue *)0x16abad);
  if ((((0x28 < in_R9D) && (in_R9D < 0x2b)) && ((TVar1 >> 0x18 & 0x1f) - 0xf < 5)) &&
     ((local_68 >> 0x18 & 0x1f) - 0xf < 5)) {
    n = lj_vm_foldarith((double)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),in_RDI
                        ,TVar1);
    iVar2 = numisint(n);
    if (iVar2 != 0) {
      *(ushort *)((long)in_RDI + 0xa4) = ((short)in_R9D + 0xc) * 0x100 | 0x93;
      *(short *)((long)in_RDI + 0xa0) = (short)TVar1;
      *(short *)((long)in_RDI + 0xa2) = (short)local_68;
      TVar1 = lj_opt_fold(in_R8);
      return TVar1;
    }
  }
  if ((TVar1 & 0x1f000000) != 0xe000000) {
    *(undefined2 *)((long)in_RDI + 0xa4) = 0x590e;
    *(short *)((long)in_RDI + 0xa0) = (short)TVar1;
    *(undefined2 *)((long)in_RDI + 0xa2) = 0x1d3;
    TVar1 = lj_opt_fold(in_R8);
  }
  uVar3 = (undefined2)TVar1;
  if ((local_68 & 0x1f000000) != 0xe000000) {
    *(undefined2 *)((long)in_RDI + 0xa4) = 0x590e;
    *(short *)((long)in_RDI + 0xa0) = (short)local_68;
    *(undefined2 *)((long)in_RDI + 0xa2) = 0x1d3;
    local_68 = lj_opt_fold(in_R8);
  }
  *(ushort *)((long)in_RDI + 0xa4) = (ushort)(in_R9D << 8) | 0xe;
  *(undefined2 *)((long)in_RDI + 0xa0) = uVar3;
  *(short *)((long)in_RDI + 0xa2) = (short)local_68;
  TVar1 = lj_opt_fold(in_R8);
  return TVar1;
}

Assistant:

TRef lj_opt_narrow_arith(jit_State *J, TRef rb, TRef rc,
			 TValue *vb, TValue *vc, IROp op)
{
  rb = conv_str_tonum(J, rb, vb);
  rc = conv_str_tonum(J, rc, vc);
  /* Must not narrow MUL in non-DUALNUM variant, because it loses -0. */
  if ((op >= IR_ADD && op <= (LJ_DUALNUM ? IR_MUL : IR_SUB)) &&
      tref_isinteger(rb) && tref_isinteger(rc) &&
      numisint(lj_vm_foldarith(numberVnum(vb), numberVnum(vc),
			       (int)op - (int)IR_ADD)))
    return emitir(IRTGI((int)op - (int)IR_ADD + (int)IR_ADDOV), rb, rc);
  if (!tref_isnum(rb)) rb = emitir(IRTN(IR_CONV), rb, IRCONV_NUM_INT);
  if (!tref_isnum(rc)) rc = emitir(IRTN(IR_CONV), rc, IRCONV_NUM_INT);
  return emitir(IRTN(op), rb, rc);
}